

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O1

int128_t * primecount::pi_gourdon(int128_t *__return_storage_ptr__,int128_t x,int threads)

{
  undefined1 x_00 [16];
  bool is_print;
  int128_t *piVar1;
  int in_EDX;
  undefined8 unaff_RBX;
  int in_register_00000034;
  undefined8 unaff_R14;
  
  if (-1 < in_register_00000034) {
    is_print = primecount::is_print();
    if (-CONCAT44(in_register_00000034,threads) <
        (long)(ulong)((int128_t *)0x7fffffffffffffff < __return_storage_ptr__)) {
      x_00._8_8_ = unaff_R14;
      x_00._0_8_ = unaff_RBX;
      piVar1 = pi_gourdon_128(__return_storage_ptr__,(int128_t)x_00,threads,SUB41(in_EDX,0));
    }
    else {
      piVar1 = (int128_t *)pi_gourdon_64((int64_t)__return_storage_ptr__,in_EDX,is_print);
    }
    return piVar1;
  }
  return (int128_t *)0x0;
}

Assistant:

int128_t pi_gourdon(int128_t x, int threads)
{
  // Prevent 64-bit cast to random
  // integer if x <= -2^63.
  if (x < 0)
    return 0;

  // Use 64-bit if possible
  if (x <= pstd::numeric_limits<int64_t>::max())
    return pi_gourdon_64((int64_t) x, threads);
  else
    return pi_gourdon_128(x, threads);
}